

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteSamplingJSON.h
# Opt level: O0

void jaegertracing::sampling_manager::thrift::from_json
               (json *json,PerOperationSamplingStrategies *strategies)

{
  PerOperationSamplingStrategies *pPVar1;
  PerOperationSamplingStrategies *pPVar2;
  bool bVar3;
  const_reference pvVar4;
  pointer this;
  double dVar5;
  const_iterator local_f8;
  undefined1 local_d8 [8];
  const_iterator itr;
  key_type local_b0;
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  local_90;
  allocator local_71;
  key_type local_70;
  allocator local_39;
  key_type local_38;
  PerOperationSamplingStrategies *local_18;
  PerOperationSamplingStrategies *strategies_local;
  json *json_local;
  
  local_18 = strategies;
  strategies_local = (PerOperationSamplingStrategies *)json;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"defaultSamplingProbability",&local_39);
  pvVar4 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(json,&local_38);
  dVar5 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_double<double,_0>(pvVar4);
  PerOperationSamplingStrategies::__set_defaultSamplingProbability(strategies,dVar5);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pPVar2 = strategies_local;
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"defaultLowerBoundTracesPerSecond",&local_71);
  pvVar4 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)pPVar2,&local_70);
  dVar5 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_double<double,_0>(pvVar4);
  PerOperationSamplingStrategies::__set_defaultLowerBoundTracesPerSecond(pPVar1,dVar5);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pPVar2 = strategies_local;
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"perOperationStrategies",
             (allocator *)((long)&itr.m_it.primitive_iterator.m_it + 7));
  pvVar4 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)pPVar2,&local_b0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_vector<std::vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>,_0>
            (&local_90,pvVar4);
  PerOperationSamplingStrategies::__set_perOperationStrategies(pPVar1,&local_90);
  std::
  vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ::~vector(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&itr.m_it.primitive_iterator.m_it + 7))
  ;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[33]>
            ((const_iterator *)local_d8,strategies_local,
             (char (*) [33])"defaultUpperBoundTracesPerSecond");
  std::
  end<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_f8,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)strategies_local);
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_d8,&local_f8);
  pPVar1 = local_18;
  if (bVar3) {
    this = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator->((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)local_d8);
    dVar5 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<double,_double,_0>(this);
    PerOperationSamplingStrategies::__set_defaultUpperBoundTracesPerSecond(pPVar1,dVar5);
  }
  return;
}

Assistant:

inline void from_json(const nlohmann::json& json,
                      PerOperationSamplingStrategies& strategies)
{
    FIELD_FROM_JSON(strategies, defaultSamplingProbability);
    FIELD_FROM_JSON(strategies, defaultLowerBoundTracesPerSecond);
    FIELD_FROM_JSON(strategies, perOperationStrategies);
    auto itr = json.find("defaultUpperBoundTracesPerSecond");
    if (itr != std::end(json)) {
        strategies.__set_defaultUpperBoundTracesPerSecond(itr->get<double>());
    }
}